

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_tree.cpp
# Opt level: O1

int __thiscall RegexTree::block_len(RegexTree *this,char *start)

{
  long lVar1;
  int iVar2;
  char cVar3;
  
  cVar3 = *start;
  if (cVar3 != '\0') {
    iVar2 = 1;
    lVar1 = 1;
    do {
      iVar2 = (iVar2 + (uint)(cVar3 == '(')) - (uint)(cVar3 == ')');
      if (iVar2 == 0) {
        return (int)lVar1;
      }
      cVar3 = start[lVar1];
      lVar1 = lVar1 + 1;
    } while (cVar3 != '\0');
  }
  return -1;
}

Assistant:

int RegexTree::block_len(const char *start) {
    int stack = 1;
    for (int i = 0; start[i] != '\0'; i++) {
        if (start[i] == '(') ++stack;
        if (start[i] == ')') --stack;
        if (stack == 0) return i + 1;
    }
    return -1;
}